

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::InsertVerilatorPublic::insert_str(Var *var)

{
  allocator<char> local_31;
  string local_30;
  Var *local_10;
  Var *var_local;
  
  local_10 = var;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30," /*verilator public*/",&local_31);
  Var::set_after_var_str_(var,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void static insert_str(Var *var) { var->set_after_var_str_(" /*verilator public*/"); }